

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O1

void __thiscall
ExternalFixupMembersImport_IsWeak_Test::TestBody(ExternalFixupMembersImport_IsWeak_Test *this)

{
  database *db;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  pointer message_00;
  char *in_R9;
  pointer *__ptr_2;
  error_code eVar1;
  AssertionResult gtest_ar;
  mock_mutex mutex;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  string_mapping imported_names;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1f8;
  undefined1 local_1f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  mutex_type local_1c9;
  undefined1 local_1c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  undefined1 local_1b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  AssertHelper local_198;
  not_null<pstore::transaction_base_*> local_190;
  undefined1 local_188 [8];
  bool local_180 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [4];
  error_code local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  transaction<std::unique_lock<mock_mutex>_> local_e0;
  string_mapping local_a8;
  
  db = &(this->super_ExternalFixupMembersImport).db_;
  local_188 = (undefined1  [8])&local_1c9;
  local_180[0] = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_188);
  local_180[0] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_e0,db,(unique_lock<mock_mutex> *)local_188);
  if ((local_180[0] == true) && (local_188 != (undefined1  [8])0x0)) {
    local_180[0] = false;
  }
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8.strings_;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8.views_;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  local_a8.lookup_._M_h._M_buckets = &local_a8.lookup_._M_h._M_single_bucket;
  local_a8.lookup_._M_h._M_bucket_count = 1;
  local_a8.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8.lookup_._M_h._M_element_count = 0;
  local_a8.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_190.ptr_ = &local_e0.super_transaction_base;
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_a8.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_a8.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  pstore::gsl::not_null<pstore::transaction_base_*>::ensure_invariant(&local_190);
  local_188 = (undefined1  [8])local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"name","");
  eVar1 = pstore::exchange::import_ns::string_mapping::add_string
                    (&local_a8,(not_null<transaction_base_*>)local_190.ptr_,(string *)local_188);
  local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)eVar1._M_cat;
  local_1b8._0_4_ = eVar1._M_value;
  local_1c8._0_4_ = 0;
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::_V2::system_category();
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_1f0,"imported_names.add_string (&transaction, \"name\")",
             "std::error_code{}",(error_code *)local_1b8,(error_code *)local_1c8);
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,local_178[0]._M_allocated_capacity + 1);
  }
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if (local_1e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_1e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x216,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
    if (local_188 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_188 + 8))();
    }
    if (local_1e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e8,local_1e8);
    }
    goto LAB_001852a5;
  }
  if (local_1e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e8,local_1e8);
  }
  local_1f0 = (undefined1  [8])&local_1e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f0,"{ \"name\":0, \"type\":17, \"offset\":19, \"addend\":23 }","");
  anon_unknown.dwarf_437d0d::ExternalFixupMembersImport::parse
            ((parser<pstore::exchange::import_ns::callbacks> *)local_188,(string *)local_1f0,db,
             &local_a8);
  if (local_1f0 != (undefined1  [8])&local_1e0) {
    operator_delete((void *)local_1f0,local_1e0._M_allocated_capacity + 1);
  }
  local_1c8[0] = local_130._M_value == 0;
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_130._M_value != 0) {
    testing::Message::Message((Message *)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1f8._M_head_impl + 0x10),"JSON error was: ",0x10);
    (**(code **)(*(long *)local_130._M_cat + 0x20))(local_1f0,local_130._M_cat,local_130._M_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1f8._M_head_impl + 0x10),(char *)local_1f0,(long)local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b8,(internal *)local_1c8,(AssertionResult *)"parser1.has_error ()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x21c,(char *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_));
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != &local_1a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_),
                      local_1a8._M_allocated_capacity + 1);
    }
    if (local_1f0 != (undefined1  [8])&local_1e0) {
      operator_delete((void *)local_1f0,local_1e0._M_allocated_capacity + 1);
    }
    if (local_1f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1f8._M_head_impl + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
  }
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
            *)local_180);
  if (local_188 != (undefined1  [8])0x0) {
    operator_delete((void *)local_188,0x68);
  }
  local_1f0 = (undefined1  [8])&local_1e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f0,
             "{ \"name\":0, \"type\":true, \"is_weak\":0, offset\":19, \"addend\":23 }","");
  anon_unknown.dwarf_437d0d::ExternalFixupMembersImport::parse
            ((parser<pstore::exchange::import_ns::callbacks> *)local_188,(string *)local_1f0,db,
             &local_a8);
  if (local_1f0 != (undefined1  [8])&local_1e0) {
    operator_delete((void *)local_1f0,local_1e0._M_allocated_capacity + 1);
  }
  local_1b8[0] = local_130._M_value != 0;
  local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_130._M_value == 0) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1b0;
    testing::Message::Message((Message *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_1c8._4_4_,local_1c8._0_4_) + 0x10),
               "Expected the parse to fail",0x1a);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f0,(internal *)local_1b8,(AssertionResult *)"parser2.has_error ()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x224,(char *)local_1f0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if (local_1f0 != (undefined1  [8])&local_1e0) {
      operator_delete((void *)local_1f0,local_1e0._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) + 8))();
    }
    local_1e8 = local_1b0;
    if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00185251;
  }
  else {
    eVar1 = pstore::exchange::import_ns::make_error_code(unexpected_boolean);
    local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)eVar1._M_cat;
    local_1b8._0_4_ = eVar1._M_value;
    testing::internal::CmpHelperEQ<std::error_code,std::error_code>
              ((internal *)local_1f0,"parser2.last_error ()",
               "make_error_code (pstore::exchange::import_ns::error::unexpected_boolean)",&local_130
               ,(error_code *)local_1b8);
    if (local_1f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1b8);
      if (local_1e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message_00 = "";
      }
      else {
        message_00 = (local_1e8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,0x226,message_00);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1c8,(Message *)local_1b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1c8);
      if ((long *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) + 8))();
      }
    }
    if (local_1e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_1e8;
LAB_00185251:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_1e8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
  }
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
            *)local_180);
  if (local_188 != (undefined1  [8])0x0) {
    operator_delete((void *)local_188,0x68);
  }
LAB_001852a5:
  pstore::exchange::import_ns::string_mapping::~string_mapping(&local_a8);
  local_e0.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0023bdb8;
  pstore::transaction_base::rollback(&local_e0.super_transaction_base);
  return;
}

Assistant:

TEST_F (ExternalFixupMembersImport, IsWeak) {
    mock_mutex mutex;
    auto transaction = begin (db_, transaction_lock{mutex});

    pstore::exchange::import_ns::string_mapping imported_names;
    // Add a single name with index 0.
    ASSERT_EQ (imported_names.add_string (&transaction, "name"), std::error_code{});

    // The is_weak key is missing altogether. That's okay: the default is 'false'.
    {
        auto const & parser1 = this->parse (R"({ "name":0, "type":17, "offset":19, "addend":23 })",
                                            &db_, imported_names);
        EXPECT_FALSE (parser1.has_error ())
            << "JSON error was: " << parser1.last_error ().message ();
    }
    // The is_weak key has the wrong type.
    {
        auto const & parser2 =
            this->parse (R"({ "name":0, "type":true, "is_weak":0, offset":19, "addend":23 })", &db_,
                         imported_names);
        ASSERT_TRUE (parser2.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser2.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::unexpected_boolean));
    }
}